

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

void add_pattern(pattern_list *list,char *pattern)

{
  size_t sVar1;
  pattern *ppVar2;
  int *piVar3;
  
  debug("adding pattern \'%s\'\n");
  sVar1 = strlen(pattern);
  ppVar2 = (pattern *)malloc(sVar1 + 9);
  if (ppVar2 != (pattern *)0x0) {
    memcpy(ppVar2 + 1,pattern,sVar1 + 1);
    (ppVar2->link).stqe_next = (pattern *)0x0;
    *list->stqh_last = ppVar2;
    list->stqh_last = (pattern **)ppVar2;
    return;
  }
  piVar3 = __errno_location();
  *piVar3 = 0xc;
  error("malloc()");
}

Assistant:

static void
add_pattern(struct pattern_list *list, const char *pattern)
{
	struct pattern *entry;
	size_t len;

	debug("adding pattern '%s'\n", pattern);
	len = strlen(pattern);
	if ((entry = malloc(sizeof *entry + len + 1)) == NULL) {
		errno = ENOMEM;
		error("malloc()");
	}
	memcpy(entry->pattern, pattern, len + 1);
	STAILQ_INSERT_TAIL(list, entry, link);
}